

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O1

void resampler_clear(void *_r)

{
  resampler *r;
  
  *(undefined4 *)_r = 0xf;
  *(undefined8 *)((long)_r + 4) = 0;
  *(undefined8 *)((long)_r + 0xc) = 0;
  *(undefined4 *)((long)_r + 0x14) = 0;
  *(undefined2 *)((long)_r + 0x31) = 0xffff;
  *(undefined8 *)((long)_r + 0x48) = 0;
  *(undefined8 *)((long)_r + 0x50) = 0;
  *(undefined8 *)((long)_r + 0x58) = 0;
  *(undefined8 *)((long)_r + 0x60) = 0;
  *(undefined8 *)((long)_r + 0x68) = 0;
  *(undefined8 *)((long)_r + 0x70) = 0;
  *(undefined8 *)((long)_r + 0x74) = 0;
  *(undefined8 *)((long)_r + 0x7c) = 0;
  *(undefined8 *)((long)_r + 0x148) = 0;
  *(undefined8 *)((long)_r + 0x150) = 0;
  *(undefined8 *)((long)_r + 0x158) = 0;
  *(undefined8 *)((long)_r + 0x160) = 0;
  *(undefined8 *)((long)_r + 0x168) = 0;
  *(undefined8 *)((long)_r + 0x170) = 0;
  *(undefined8 *)((long)_r + 0x174) = 0;
  *(undefined8 *)((long)_r + 0x17c) = 0;
  if ((*(byte *)((long)_r + 0x30) | 2) == 3) {
    *(undefined8 *)((long)_r + 0x20) = 0;
    memset((void *)((long)_r + 0x248),0,0x17c);
    *(undefined8 *)((long)_r + 0x38) = 0;
    *(undefined8 *)((long)_r + 0x40) = 0;
  }
  return;
}

Assistant:

void resampler_clear(void *_r)
{
    resampler * r = ( resampler * ) _r;
    r->write_pos = SINC_WIDTH - 1;
    r->write_filled = 0;
    r->read_pos = 0;
    r->read_filled = 0;
    r->phase.quad = 0;
    r->delay_added = -1;
    r->delay_removed = -1;
    memset(r->buffer_in, 0, (SINC_WIDTH - 1) * sizeof(r->buffer_in[0]));
    memset(r->buffer_in + resampler_buffer_size, 0, (SINC_WIDTH - 1) * sizeof(r->buffer_in[0]));
    if (r->quality == RESAMPLER_QUALITY_BLEP || r->quality == RESAMPLER_QUALITY_BLAM)
    {
        r->inv_phase.quad = 0;
        r->last_amp = 0;
        r->accumulator = 0;
        memset(r->buffer_out, 0, sizeof(r->buffer_out));
    }
}